

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cc
# Opt level: O1

Result wabt::ParseHexdigit(char c,uint32_t *out)

{
  int iVar1;
  uint uVar2;
  undefined7 in_register_00000039;
  
  iVar1 = (int)CONCAT71(in_register_00000039,c);
  uVar2 = iVar1 - 0x30;
  if (9 < uVar2) {
    if (iVar1 - 0x61U < 7) {
      uVar2 = iVar1 - 0x57;
    }
    else {
      if (6 < iVar1 - 0x41U) {
        return (Result)Error;
      }
      uVar2 = iVar1 - 0x37;
    }
  }
  *out = uVar2;
  return (Result)Ok;
}

Assistant:

Result ParseHexdigit(char c, uint32_t* out) {
  if (static_cast<unsigned int>(c - '0') <= 9) {
    *out = c - '0';
    return Result::Ok;
  } else if (static_cast<unsigned int>(c - 'a') <= 6) {
    *out = 10 + (c - 'a');
    return Result::Ok;
  } else if (static_cast<unsigned int>(c - 'A') <= 6) {
    *out = 10 + (c - 'A');
    return Result::Ok;
  }
  return Result::Error;
}